

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O2

void __thiscall
WavingSketch<8U,_1U,_4U>::Check
          (WavingSketch<8U,_1U,_4U> *this,HashMap<4U> *mp,Abstract<4U> *another,
          vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
          *outs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  __node_base *p_Var9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  
  p_Var9 = &(mp->_M_h)._M_before_begin;
  auVar13 = ZEXT1664((undefined1  [16])0x0);
  iVar10 = 0;
  while( true ) {
    p_Var9 = p_Var9->_M_nxt;
    if (p_Var9 == (__node_base *)0x0) break;
    iVar6 = (*(this->super_Abstract<4U>)._vptr_Abstract[1])(this,p_Var9 + 1,mp);
    iVar7 = (*another->_vptr_Abstract[1])(another,p_Var9 + 1,mp);
    auVar14 = vpinsrd_avx(ZEXT416((uint)(iVar6 - iVar7)),*(undefined4 *)((long)(p_Var9 + 1) + 4),1);
    auVar14 = vpabsd_avx(auVar14);
    iVar6 = (this->super_Abstract<4U>).HIT;
    auVar12._4_4_ = iVar6;
    auVar12._0_4_ = iVar6;
    auVar12._8_4_ = iVar6;
    auVar12._12_4_ = iVar6;
    uVar5 = vpcmpgtd_avx512vl(auVar14,auVar12);
    iVar10 = iVar10 + (uint)((~((byte)uVar5 & 0xf) & 3) == 0);
    auVar14 = vpcmpgtd_avx(auVar14,auVar12);
    auVar14 = vpsubd_avx(auVar13._0_16_,auVar14);
    auVar13 = ZEXT1664(auVar14);
  }
  auVar11._0_8_ = (double)iVar10;
  auVar14 = vcvtdq2pd_avx(auVar13._0_16_);
  auVar11._8_8_ = auVar11._0_8_;
  auVar14 = vdivpd_avx(auVar11,auVar14);
  (this->super_Abstract<4U>).pr = (double)auVar14._0_8_;
  (this->super_Abstract<4U>).cr = (double)auVar14._8_8_;
  auVar14 = vshufpd_avx(auVar14,auVar14,1);
  poVar8 = std::ostream::_M_insert<double>(auVar14._0_8_);
  std::operator<<(poVar8,",");
  poVar8 = std::ostream::_M_insert<double>((this->super_Abstract<4U>).pr);
  std::operator<<(poVar8,",");
  dVar1 = (this->super_Abstract<4U>).pr;
  dVar2 = (this->super_Abstract<4U>).cr;
  dVar3 = dVar1 + dVar2;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar3;
  uVar5 = vcmpsd_avx512f(auVar14,ZEXT816(0x3e112e0be826d695),1);
  bVar4 = (bool)((byte)uVar5 & 1);
  poVar8 = std::ostream::_M_insert<double>
                     (((dVar1 + dVar1) * dVar2) /
                      (double)((ulong)bVar4 * 0x3ff0000000000000 + (ulong)!bVar4 * (long)dVar3));
  std::operator<<(poVar8,",");
  return;
}

Assistant:

virtual void Check(HashMap<DATA_LEN> mp, Abstract<DATA_LEN>* another, const std::vector<std::ostream*>& outs) {
		typename HashMap<DATA_LEN>::iterator it;
		int value = 0, all = 0, hit = 0, size = 0;
		for (it = mp.begin(); it != mp.end(); ++it) {
			value = abs((Query(it->first, mp) - another->Query(it->first, mp)));
			if (abs(it->second) > this->HIT) {
				all++;
				if (value > this->HIT) {
					hit += 1;
				}
			}
			if (value > this->HIT) size += 1;
		}
		this->cr = hit / (double)all;
		this->pr = hit / (double)size;
		*outs[0] << this->cr << ",";
		*outs[1] << this->pr << ",";
		*outs[2] << 2 * this->pr * this->cr / ((this->pr + this->cr < 1e-9) ? 1.0 : this->pr + this->cr) << ",";
		// cout << all << " " << size << endl;
		// cout << this->cr << " " << this->pr << endl;
	}